

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseCompiler::_newStack
          (BaseCompiler *this,BaseMem *out,uint32_t size,uint32_t alignment,char *name)

{
  uint uVar1;
  Error EVar2;
  uint in_ECX;
  int in_EDX;
  uint *in_RSI;
  VirtReg **in_RDI;
  Error _err;
  VirtReg *vReg;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  byte bVar3;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  long local_110;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  OperandSignature in_stack_ffffffffffffff20;
  
  *in_RSI = 2;
  in_RSI[1] = 0;
  in_RSI[2] = 0;
  in_RSI[3] = 0;
  if (in_EDX == 0) {
    DebugUtils::errored(2);
    EVar2 = BaseEmitter::reportError
                      ((BaseEmitter *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (Error)((ulong)in_RDI >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  }
  else {
    if (in_ECX == 0) {
      in_ECX = 1;
    }
    bVar3 = 0;
    if (in_ECX != 0) {
      bVar3 = (in_ECX & in_ECX - 1) != 0 ^ 0xff;
    }
    if ((bVar3 & 1) == 0) {
      DebugUtils::errored(2);
      EVar2 = BaseEmitter::reportError
                        ((BaseEmitter *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         (Error)((ulong)in_RDI >> 0x20),
                         (char *)CONCAT17(bVar3,in_stack_fffffffffffffeb0));
    }
    else {
      if (0x40 < in_ECX) {
        in_ECX = 0x40;
      }
      EVar2 = newVirtReg((BaseCompiler *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),in_RDI,
                         (TypeId)((ulong)in_RSI >> 0x38),in_stack_ffffffffffffff20,
                         (char *)CONCAT44(in_EDX,in_ECX));
      if (EVar2 == 0) {
        *(int *)(local_110 + 8) = in_EDX;
        *(byte *)(local_110 + 0xf) = *(byte *)(local_110 + 0xf) & 0xfd | 2;
        *(char *)(local_110 + 0xc) = (char)in_ECX;
        uVar1 = *(uint *)(local_110 + 4);
        *in_RSI = (uint)((byte)(*(uint *)(in_RDI + 10) >> 3) & 0x1f) << 3 | 0x2002;
        in_RSI[1] = uVar1;
        in_RSI[2] = 0;
        in_RSI[3] = 0;
        EVar2 = 0;
      }
    }
  }
  return EVar2;
}

Assistant:

Error BaseCompiler::_newStack(BaseMem* out, uint32_t size, uint32_t alignment, const char* name) {
  out->reset();

  if (size == 0)
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment == 0)
    alignment = 1;

  if (!Support::isPowerOf2(alignment))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment > 64)
    alignment = 64;

  VirtReg* vReg;
  ASMJIT_PROPAGATE(newVirtReg(&vReg, TypeId::kVoid, OperandSignature{0}, name));
  ASMJIT_ASSUME(vReg != nullptr);

  vReg->_virtSize = size;
  vReg->_isStack = true;
  vReg->_alignment = uint8_t(alignment);

  // Set the memory operand to GPD/GPQ and its id to VirtReg.
  *out = BaseMem(OperandSignature::fromOpType(OperandType::kMem) |
                 OperandSignature::fromMemBaseType(_gpSignature.regType()) |
                 OperandSignature::fromBits(OperandSignature::kMemRegHomeFlag),
                 vReg->id(), 0, 0);
  return kErrorOk;
}